

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::x86::
     interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (int index,Context *context)

{
  uint16_t *puVar1;
  uint16_t local_22;
  type_conflict3 local_20;
  type_conflict3 local_1e;
  uint32_t uStack_1c;
  uint16_t flags;
  uint16_t cs;
  uint16_t ip;
  uint32_t address;
  Context *context_local;
  int index_local;
  
  uStack_1c = index << 2;
  _cs = context;
  context_local._4_4_ = index;
  PCCompatible::Memory::preauthorise_read(&context->memory,uStack_1c,4);
  PCCompatible::Memory::preauthorise_stack_write(&_cs->memory,6);
  local_1e = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                       (&_cs->memory,uStack_1c);
  local_20 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                       (&_cs->memory,uStack_1c + 2);
  local_22 = Flags::get(&_cs->flags);
  Primitive::
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (&local_22,_cs);
  Flags::set_from<(InstructionSet::x86::Flag)5,(InstructionSet::x86::Flag)4>(&_cs->flags,0);
  puVar1 = PCCompatible::Registers::cs(&_cs->registers);
  Primitive::
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (puVar1,_cs);
  puVar1 = PCCompatible::Registers::ip(&_cs->registers);
  Primitive::
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (puVar1,_cs);
  PCCompatible::FlowController::jump<unsigned_short>(&_cs->flow_controller,local_20,local_1e);
  return;
}

Assistant:

void interrupt(
	int index,
	ContextT &context
) {
	const uint32_t address = static_cast<uint32_t>(index) << 2;
	context.memory.preauthorise_read(address, sizeof(uint16_t) * 2);
	context.memory.preauthorise_stack_write(sizeof(uint16_t) * 3);

	const uint16_t ip = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(address);
	const uint16_t cs = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(address + 2);

	auto flags = context.flags.get();
	Primitive::push<uint16_t, true>(flags, context);
	context.flags.template set_from<Flag::Interrupt, Flag::Trap>(0);

	// Push CS and IP.
	Primitive::push<uint16_t, true>(context.registers.cs(), context);
	Primitive::push<uint16_t, true>(context.registers.ip(), context);

	// Set new destination.
	context.flow_controller.jump(cs, ip);
}